

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SQLiteBuildDB.cpp
# Opt level: O1

int __thiscall
anon_unknown.dwarf_548f58::SQLiteBuildDB::open(SQLiteBuildDB *this,char *__file,int __oflag,...)

{
  sqlite3 **ppsVar1;
  int iVar2;
  int __val;
  uint __val_00;
  char *pcVar3;
  long *plVar4;
  int *piVar5;
  undefined8 uVar6;
  size_type *psVar7;
  undefined8 unaff_R15;
  sqlite3_stmt *stmt;
  char *cError;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  undefined8 local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (this->db != (sqlite3 *)0x0) {
    return (int)CONCAT71((int7)((ulong)unaff_R15 >> 8),1);
  }
  if ((anonymous_namespace)::SQLiteBuildDB::open(std::__cxx11::string*)::sqliteConfigureResult ==
      '\0') {
    _GLOBAL__N_1::SQLiteBuildDB::open((char *)this,(int)__file,___oflag);
  }
  if ((open::sqliteConfigureResult != 0) && (iVar2 = sqlite3_threadsafe(), iVar2 == 0)) {
    std::__cxx11::string::_M_replace((ulong)__file,0,*(char **)(__file + 8),0x2189e6);
    return 0;
  }
  ppsVar1 = &this->db;
  iVar2 = sqlite3_open((this->path)._M_dataplus._M_p,ppsVar1);
  if (iVar2 != 0) {
    pcVar3 = (char *)sqlite3_errstr(iVar2);
    std::__cxx11::string::string((string *)&local_230,pcVar3,(allocator *)&local_1f0);
    plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_230,0,(char *)0x0,0x218a14);
    psVar7 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_258.field_2._M_allocated_capacity = *psVar7;
      local_258.field_2._8_8_ = plVar4[3];
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    }
    else {
      local_258.field_2._M_allocated_capacity = *psVar7;
      local_258._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_258._M_string_length = plVar4[1];
    *plVar4 = (long)psVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::operator=((string *)__file,(string *)&local_258);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    local_190.field_2._M_allocated_capacity = local_230.field_2._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p == &local_230.field_2) {
      return 0;
    }
    goto LAB_001da7dc;
  }
  sqlite3_busy_timeout(*ppsVar1,5000);
  __val_00 = 0;
  __val = -1;
  iVar2 = sqlite3_prepare_v2(*ppsVar1,"SELECT version,client_version FROM info LIMIT 1",0xffffffff,
                             &local_238,0);
  if (iVar2 == 0) {
    iVar2 = sqlite3_step(local_238);
    if (iVar2 == 0x65) {
      __val_00 = 0;
      __val = -1;
    }
    else {
      if (iVar2 != 100) {
        (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_(&local_258,this);
        std::__cxx11::string::operator=((string *)__file,(string *)&local_258);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
        }
        sqlite3_finalize(local_238);
        return 0;
      }
      iVar2 = sqlite3_column_count(local_238);
      if (iVar2 != 2) {
        __assert_fail("sqlite3_column_count(stmt) == 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/SQLiteBuildDB.cpp"
                      ,0xa3,"bool (anonymous namespace)::SQLiteBuildDB::open(std::string *)");
      }
      __val = sqlite3_column_int(local_238,0);
      __val_00 = sqlite3_column_int(local_238,1);
    }
    sqlite3_finalize(local_238);
LAB_001da634:
    if ((__val != 0x11) || (__val_00 != this->clientSchemaVersion)) {
      sqlite3_close(this->db);
      this->db = (sqlite3 *)0x0;
      if (this->recreateOnUnmatchedVersion == false) {
        local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_190,"Version mismatch. (database-schema: ","");
        std::__cxx11::to_string(&local_d0,__val);
        std::operator+(&local_b0,&local_190,&local_d0);
        local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1b0," requested schema: ","");
        std::operator+(&local_90,&local_b0,&local_1b0);
        std::__cxx11::to_string(&local_f0,0x11);
        std::operator+(&local_70,&local_90,&local_f0);
        local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1d0,". database-client: ","");
        std::operator+(&local_50,&local_70,&local_1d0);
        std::__cxx11::to_string(&local_110,__val_00);
        std::operator+(&local_210,&local_50,&local_110);
        local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_150," requested client: ","");
        std::operator+(&local_1f0,&local_210,&local_150);
        std::__cxx11::to_string(&local_130,this->clientSchemaVersion);
        std::operator+(&local_230,&local_1f0,&local_130);
        local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,")","");
        std::operator+(&local_258,&local_230,&local_170);
        std::__cxx11::string::operator=((string *)__file,(string *)&local_258);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p != &local_170.field_2) {
          operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != &local_230.field_2) {
          operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
          operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != &local_210.field_2) {
          operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
          operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
          operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        local_230._M_dataplus._M_p = local_190._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p == &local_190.field_2) {
          return 0;
        }
        goto LAB_001da7dc;
      }
      iVar2 = llbuild::basic::sys::unlink((this->path)._M_dataplus._M_p);
      if (iVar2 == -1) {
        piVar5 = __errno_location();
        if (*piVar5 != 2) {
          local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_230,"unable to unlink existing database: ","");
          strerror(*piVar5);
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_230);
          psVar7 = (size_type *)(plVar4 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar4 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar7) {
            local_258.field_2._M_allocated_capacity = *psVar7;
            local_258.field_2._8_8_ = plVar4[3];
            local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
          }
          else {
            local_258.field_2._M_allocated_capacity = *psVar7;
            local_258._M_dataplus._M_p = (pointer)*plVar4;
          }
          local_258._M_string_length = plVar4[1];
          *plVar4 = (long)psVar7;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          std::__cxx11::string::operator=((string *)__file,(string *)&local_258);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._M_dataplus._M_p != &local_258.field_2) {
            operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_230._M_dataplus._M_p != &local_230.field_2) {
            operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
          }
          goto LAB_001daf14;
        }
      }
      else {
        iVar2 = sqlite3_open((this->path)._M_dataplus._M_p,ppsVar1);
        if (iVar2 != 0) goto LAB_001da7b1;
      }
      iVar2 = sqlite3_exec(*ppsVar1,"BEGIN EXCLUSIVE;",0,0,&local_210);
      if ((iVar2 == 0) &&
         (iVar2 = sqlite3_exec(*ppsVar1,
                               "CREATE TABLE info (id INTEGER PRIMARY KEY, version INTEGER, client_version INTEGER, iteration INTEGER);"
                               ,0,0,&local_210), iVar2 == 0)) {
        uVar6 = sqlite3_mprintf("INSERT INTO info VALUES (0, %d, %d, 0);",0x11,
                                this->clientSchemaVersion);
        iVar2 = sqlite3_exec(this->db,uVar6,0,0,&local_210);
        sqlite3_free(uVar6);
        if ((iVar2 == 0) &&
           ((((iVar2 = sqlite3_exec(*ppsVar1,
                                    "CREATE TABLE key_names (id INTEGER PRIMARY KEY, key STRING UNIQUE);"
                                    ,0,0,&local_210), iVar2 == 0 &&
              (iVar2 = sqlite3_exec(*ppsVar1,
                                    "CREATE TABLE rule_results (key_id INTEGER PRIMARY KEY, value BLOB, signature INTEGER, built_at INTEGER, computed_at INTEGER, start REAL, end REAL, dependencies BLOB, FOREIGN KEY(key_id) REFERENCES key_names(id));"
                                    ,0,0,&local_210), iVar2 == 0)) &&
             (iVar2 = sqlite3_exec(*ppsVar1,
                                   "CREATE UNIQUE INDEX rule_results_idx ON rule_results (key_id);",
                                   0,0,&local_210), iVar2 == 0)) &&
            (iVar2 = sqlite3_exec(*ppsVar1,"END;",0,0,&local_210), iVar2 == 0)))) goto LAB_001da647;
      }
      local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1f0,"unable to initialize database (","");
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_1f0);
      psVar7 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_230.field_2._M_allocated_capacity = *psVar7;
        local_230.field_2._8_8_ = plVar4[3];
        local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      }
      else {
        local_230.field_2._M_allocated_capacity = *psVar7;
        local_230._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_230._M_string_length = plVar4[1];
      *plVar4 = (long)psVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_230);
      psVar7 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_258.field_2._M_allocated_capacity = *psVar7;
        local_258.field_2._8_8_ = plVar4[3];
        local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      }
      else {
        local_258.field_2._M_allocated_capacity = *psVar7;
        local_258._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_258._M_string_length = plVar4[1];
      *plVar4 = (long)psVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::operator=((string *)__file,(string *)&local_258);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
      }
      sqlite3_free(local_210._M_dataplus._M_p);
LAB_001daf14:
      sqlite3_close(*ppsVar1);
      *ppsVar1 = (sqlite3 *)0x0;
      return 0;
    }
LAB_001da647:
    iVar2 = sqlite3_prepare_v2(this->db,"SELECT id FROM key_names WHERE key == ? LIMIT 1;",
                               0xffffffff,&this->findKeyIDForKeyStmt,0);
    if (((((iVar2 == 0) &&
          (iVar2 = sqlite3_prepare_v2(this->db,"SELECT key FROM key_names WHERE id == ? LIMIT 1;",
                                      0xffffffff,&this->findKeyNameForKeyIDStmt,0), iVar2 == 0)) &&
         ((iVar2 = sqlite3_prepare_v2(this->db,"INSERT OR IGNORE INTO key_names(key) VALUES (?);",
                                      0xffffffff,&this->insertIntoKeysStmt,0), iVar2 == 0 &&
          ((iVar2 = sqlite3_prepare_v2(this->db,
                                       "INSERT OR REPLACE INTO rule_results VALUES (?, ?, ?, ?, ?, ?, ?, ?);"
                                       ,0xffffffff,&this->insertIntoRuleResultsStmt,0), iVar2 == 0
           && (iVar2 = sqlite3_prepare_v2(this->db,"DELETE FROM key_names WHERE key == ?;",
                                          0xffffffff,&this->deleteFromKeysStmt,0), iVar2 == 0))))))
        && (iVar2 = sqlite3_prepare_v2(this->db,
                                       "SELECT rule_results.key_id, value, built_at, computed_at, start, end, dependencies, signature FROM rule_results INNER JOIN key_names ON key_names.id = rule_results.key_id WHERE key == ?;"
                                       ,0xffffffff,&this->findRuleResultStmt,0), iVar2 == 0)) &&
       ((iVar2 = sqlite3_prepare_v2(this->db,
                                    "SELECT key_id, value, built_at, computed_at, start, end, dependencies, signature FROM rule_results WHERE key_id == ?;"
                                    ,0xffffffff,&this->fastFindRuleResultStmt,0), iVar2 == 0 &&
        (iVar2 = sqlite3_prepare_v2(this->db,
                                    "SELECT rule_results.key_id, key_names.key, rule_results.value, rule_results.built_at, rule_results.computed_at, rule_results.start, rule_results.end, rule_results.dependencies, rule_results.signature FROM rule_results JOIN key_names WHERE rule_results.key_id == key_names.id;"
                                    ,0xffffffff,&this->getKeysWithResultStmt,0), iVar2 == 0)))) {
      return (int)CONCAT71((int7)((ulong)ppsVar1 >> 8),1);
    }
  }
  else if (iVar2 == 1) goto LAB_001da634;
LAB_001da7b1:
  (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_(&local_258,this);
  std::__cxx11::string::operator=((string *)__file,(string *)&local_258);
  local_190.field_2._M_allocated_capacity = local_258.field_2._M_allocated_capacity;
  local_230._M_dataplus._M_p = local_258._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p == &local_258.field_2) {
    return 0;
  }
LAB_001da7dc:
  operator_delete(local_230._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  return 0;
}

Assistant:

bool open(std::string *error_out) {
    // The db is opened lazily whenever an operation on it occurs. Thus if it is
    // already open, we don't need to do any further work.
    if (db) return true;

    // Configure SQLite3 on first use.
    //
    // We attempt to set multi-threading mode, but can settle for serialized if
    // the library can't be reinitialized (there are only two modes).
    static int sqliteConfigureResult = []() -> int {
      // We access a single connection from multiple threads.
      return sqlite3_config(SQLITE_CONFIG_MULTITHREAD);
    }();
    if (sqliteConfigureResult != SQLITE_OK) {
        if (!sqlite3_threadsafe()) {
            *error_out = "unable to configure database: not thread-safe";
            return false;
        }
    }

    int result = sqlite3_open(path.c_str(), &db);
    if (result != SQLITE_OK) {
      *error_out = "unable to open database: " + std::string(
          sqlite3_errstr(result));
      return false;
    }

    sqlite3_busy_timeout(db, 5000);
    // Create the database schema, if necessary.
    char *cError;
    int version;
    uint32_t clientVersion = 0;
    sqlite3_stmt* stmt;
    result = sqlite3_prepare_v2(
      db, "SELECT version,client_version FROM info LIMIT 1",
      -1, &stmt, nullptr);
    if (result == SQLITE_ERROR) {
      version = -1;
    } else {
      if (result != SQLITE_OK) {
        *error_out = getCurrentErrorMessage();
        return false;
      }
      result = sqlite3_step(stmt);
      if (result == SQLITE_DONE) {
        version = -1;
      } else if (result == SQLITE_ROW) {
        assert(sqlite3_column_count(stmt) == 2);
        version = sqlite3_column_int(stmt, 0);
        clientVersion = sqlite3_column_int(stmt, 1);
      } else {
        *error_out = getCurrentErrorMessage();
        sqlite3_finalize(stmt);
        return false;
      }
      sqlite3_finalize(stmt);
    }

    if (version != currentSchemaVersion ||
        clientVersion != clientSchemaVersion) {
      // Close the database before we try to recreate it.
      sqlite3_close(db);
      db = nullptr;
      
      if (!recreateOnUnmatchedVersion) {
        // We don't re-create the database in this case and return an error
        *error_out = std::string("Version mismatch. (database-schema: ") + std::to_string(version) + std::string(" requested schema: ") + std::to_string(currentSchemaVersion) + std::string(". database-client: ") + std::to_string(clientVersion) + std::string(" requested client: ") + std::to_string(clientSchemaVersion) + std::string(")");
        return false;
      }

      // Always recreate the database from scratch when the schema changes.
      result = basic::sys::unlink(path.c_str());
      if (result == -1) {
        if (errno != ENOENT) {
          *error_out = std::string("unable to unlink existing database: ") +
            ::strerror(errno);
          sqlite3_close(db);
          db = nullptr;
          return false;
        }
      } else {
        // If the remove was successful, reopen the database.
        int result = sqlite3_open(path.c_str(), &db);
        if (result != SQLITE_OK) {
          *error_out = getCurrentErrorMessage();
          return false;
        }
      }

      // Create the schema in a single transaction.
      result = sqlite3_exec(db, "BEGIN EXCLUSIVE;", nullptr, nullptr, &cError);

      // Create the info table.
      if (result == SQLITE_OK) {
        result = sqlite3_exec(
          db, ("CREATE TABLE info ("
               "id INTEGER PRIMARY KEY, "
               "version INTEGER, "
               "client_version INTEGER, "
               "iteration INTEGER);"),
          nullptr, nullptr, &cError);
      }
      if (result == SQLITE_OK) {
        char* query = sqlite3_mprintf(
          "INSERT INTO info VALUES (0, %d, %d, 0);",
          currentSchemaVersion, clientSchemaVersion);
        result = sqlite3_exec(db, query, nullptr, nullptr, &cError);
        sqlite3_free(query);
      }
      if (result == SQLITE_OK) {
        result = sqlite3_exec(
          db, ("CREATE TABLE key_names ("
               "id INTEGER PRIMARY KEY, "
               "key STRING UNIQUE);"),
          nullptr, nullptr, &cError);
      }
      if (result == SQLITE_OK) {
        result = sqlite3_exec(
          db, ("CREATE TABLE rule_results ("
               "key_id INTEGER PRIMARY KEY, "
               "value BLOB, "
               "signature INTEGER, "
               "built_at INTEGER, "
               "computed_at INTEGER, "
               "start REAL, "
               "end REAL, "
               "dependencies BLOB, "
               "FOREIGN KEY(key_id) REFERENCES key_names(id));"),
          nullptr, nullptr, &cError);
      }

      // Create the indices on the rule tables.
      if (result == SQLITE_OK) {
        // Create an index to be used for efficiently looking up rule
        // information from a key.
        result = sqlite3_exec(
            db, "CREATE UNIQUE INDEX rule_results_idx ON rule_results (key_id);",
            nullptr, nullptr, &cError);
      }

      // Sync changes to disk.
      if (result == SQLITE_OK) {
        result = sqlite3_exec(db, "END;", nullptr, nullptr, &cError);
      }

      if (result != SQLITE_OK) {
        *error_out = (std::string("unable to initialize database (") + cError
                      + ")");
        sqlite3_free(cError);
        sqlite3_close(db);
        db = nullptr;
        return false;
      }
    }

    // Initialize prepared statements.
    result = sqlite3_prepare_v2(
      db, findKeyIDForKeyStmtSQL,
      -1, &findKeyIDForKeyStmt, nullptr);
    checkSQLiteResultOKReturnFalse(result);

    result = sqlite3_prepare_v2(
      db, findKeyNameForKeyIDStmtSQL,
      -1, &findKeyNameForKeyIDStmt, nullptr);
    checkSQLiteResultOKReturnFalse(result);

    result = sqlite3_prepare_v2(
      db, insertIntoKeysStmtSQL,
      -1, &insertIntoKeysStmt, nullptr);
    checkSQLiteResultOKReturnFalse(result);

    result = sqlite3_prepare_v2(
      db, insertIntoRuleResultsStmtSQL,
      -1, &insertIntoRuleResultsStmt, nullptr);
    checkSQLiteResultOKReturnFalse(result);

    result = sqlite3_prepare_v2(
      db, deleteFromKeysStmtSQL,
      -1, &deleteFromKeysStmt, nullptr);
    checkSQLiteResultOKReturnFalse(result);

    result = sqlite3_prepare_v2(
      db, findRuleResultStmtSQL,
      -1, &findRuleResultStmt, nullptr);
    checkSQLiteResultOKReturnFalse(result);

    result = sqlite3_prepare_v2(
      db, fastFindRuleResultStmtSQL,
      -1, &fastFindRuleResultStmt, nullptr);
    checkSQLiteResultOKReturnFalse(result);
    
    result = sqlite3_prepare_v2(
      db, getKeysWithResultStmtSQL,
      -1, &getKeysWithResultStmt, nullptr);
    checkSQLiteResultOKReturnFalse(result);

    return true;
  }